

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Config::emulate_mthd(MthdEmuEmuD3D0Config *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  StateTest *pSVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t val;
  int i;
  int iVar14;
  bool bVar15;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar6 = uVar2 >> 10 & 3;
  uVar9 = 0x1c80;
  if (uVar6 == 1) {
    uVar9 = 0x3ca0;
  }
  val = 0x3c80;
  if (uVar6 != 2) {
    val = uVar9;
  }
  uVar8 = 0x140000;
  if ((uVar2 >> 8 & 1) == 0) {
    uVar8 = 0x200000;
  }
  if (uVar6 == 3) {
    uVar8 = 0x200000;
  }
  uVar11 = uVar2 >> 0x1d & 1;
  bVar15 = (uVar2 >> 0x1c & 1) == 0;
  uVar7 = 0x10;
  if (bVar15) {
    uVar7 = uVar11 * 0x40 + 0x40;
  }
  uVar13 = 0x10a;
  if (bVar15) {
    uVar13 = uVar11 * 0x400 + 0x50a;
  }
  uVar11 = 0;
  if (-1 < (int)uVar2) {
    uVar11 = uVar7;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    iVar14 = ((uVar2 & 0xf) == 2) + 1;
    uVar4 = uVar2 >> 0xc & 3;
    uVar5 = uVar2 >> 6 & 3;
    uVar12 = uVar2 >> 4 & 3;
    uVar7 = 0x9000000;
    if (uVar12 != 0) {
      uVar7 = uVar12 << 0x18;
    }
    uVar12 = 0x90000000;
    if (uVar5 != 0) {
      uVar12 = uVar5 << 0x1c;
    }
    lVar10 = 0;
    do {
      uVar5 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
              [lVar10] & 0xffffef | uVar7 | (uint)((uVar2 & 0xf) == 0) << 4 | uVar12;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[lVar10] =
           uVar5;
      pgraph_celsius_icmd(state,(uint)lVar10 | 4,uVar5,false);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    do {
      uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter
              [lVar10] & 0x88ffffff | iVar14 * 0x10000000 | iVar14 * 0x1000000;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[lVar10] =
           uVar7;
      pgraph_celsius_icmd(state,(uint)lVar10 | 0xe,uVar7,false);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    uVar8 = uVar8 | (uint)(uVar6 == 3) * 0x8000000 + 0x18000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_alpha[0] = uVar8;
    pgraph_celsius_icmd(state,0x10,uVar8,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_color[0] =
         0x8040000;
    pgraph_celsius_icmd(state,0x12,0x8040000,false);
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_0[0] = uVar9;
    pgraph_celsius_icmd(state,0x14,uVar9,false);
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_1[0] = uVar9;
    pgraph_celsius_icmd(state,0x15,uVar9,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_alpha[0] = 0xc00;
    pgraph_celsius_icmd(state,0x16,0xc00,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[0] = 0xc00;
    pgraph_celsius_icmd(state,0x18,0xc00,false);
    uVar6 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] &
            0xc7ffffff | 0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] = uVar6;
    pgraph_celsius_icmd(state,0x19,uVar6,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_a = 0xc;
    pgraph_celsius_icmd(state,0x1a,0xc,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_b = val;
    pgraph_celsius_icmd(state,0x1b,val,false);
    uVar6 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar8 = (uint)((uVar6 & 0x700000) != 0);
    iVar14 = 0x38000000;
    if ((uVar6 & 0x7000000) == 0) {
      iVar14 = 0;
    }
    uVar9 = iVar14 + (uVar6 + 0xf0000 & 0xf0000 |
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_config_a & 0xc030bfff | (uVar6 & 0x8000) << 8 | uVar8 << 0xe |
                     uVar8 << 0x18) + 0x400000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a = uVar9;
    pgraph_celsius_icmd(state,0x1c,uVar9,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = 0x70;
    pgraph_celsius_icmd(state,0x1d,0x70,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b = 0x222;
    pgraph_celsius_icmd(state,0x1e,0x222,false);
    uVar6 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
            0xfffffe00 | 0x1c0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b = uVar6;
    pgraph_celsius_icmd(state,0x1f,uVar6,false);
    uVar6 = 10;
    if ((uVar2 >> 0x1e & 1) == 0) {
      uVar6 = uVar13;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend = uVar6 | uVar11;
    pgraph_celsius_icmd(state,0x20,uVar6 | uVar11,false);
    uVar9 = ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
            0xc0000000) + ((uint)(uVar4 != 3) << 0x15 | (uint)(uVar4 != 1) << 0x1c) + 0x4200000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar9;
    pgraph_celsius_icmd(state,0x22,uVar9,true);
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    pSVar3 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest;
    (pSVar3->exp).celsius_pipe_junk[2] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
    (pSVar3->exp).celsius_pipe_junk[3] = uVar9;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *puVar1 = *puVar1 | 0x1020000;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		int filt = 1;
		int origin = 0;
		int sinterp = extr(val, 0, 4);
		if (sinterp == 0)
			origin = 1;
		if (sinterp == 2)
			filt = 2;
		int wrapu = extr(val, 4, 2);
		if (wrapu == 0)
			wrapu = 9;
		int wrapv = extr(val, 6, 2);
		if (wrapv == 0)
			wrapv = 9;
		uint32_t rc_in_alpha_a = 0x18;;
		uint32_t rc_in_alpha_b = 0x14;;
		if (!extr(val, 8, 1))
			rc_in_alpha_b = 0x20;
		uint32_t rc_final_b = 0x1c80;
		int srcmode = extr(val, 10, 2);
		if (srcmode == 1)
			rc_final_b |= 0x2020;
		if (srcmode == 2)
			rc_final_b |= 0x2000;
		if (srcmode == 3) {
			rc_in_alpha_a = 0x20;
			rc_in_alpha_b = 0x20;
		}
		int scull = extr(val, 12, 2);
		int sblend = 4, dblend = 5;
		if (extr(val, 29, 1)) {
			dblend = 9;
			sblend = 8;
		}
		if (extr(val, 28, 1))
			sblend = dblend = 1;
		if (extr(val, 30, 1))
			dblend = 0;
		if (extr(val, 31, 1))
			sblend = 0;
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_format[i], 4, 1, origin);
				insrt(exp.bundle_tex_format[i], 24, 4, wrapu);
				insrt(exp.bundle_tex_format[i], 28, 4, wrapv);
				pgraph_celsius_icmd(&exp, 4 + i, exp.bundle_tex_format[i], false);
			}
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_filter[i], 24, 3, filt);
				insrt(exp.bundle_tex_filter[i], 28, 3, filt);
				pgraph_celsius_icmd(&exp, 0xe + i, exp.bundle_tex_filter[i], false);
			}
			exp.bundle_rc_in_alpha[0] = rc_in_alpha_a << 24 | rc_in_alpha_b << 16;
			pgraph_celsius_icmd(&exp, 0x10, exp.bundle_rc_in_alpha[0], false);
			exp.bundle_rc_in_color[0] = 0x08040000;
			pgraph_celsius_icmd(&exp, 0x12, exp.bundle_rc_in_color[0], false);
			exp.bundle_rc_factor_0[0] = val;
			pgraph_celsius_icmd(&exp, 0x14, exp.bundle_rc_factor_0[0], false);
			exp.bundle_rc_factor_1[0] = val;
			pgraph_celsius_icmd(&exp, 0x15, exp.bundle_rc_factor_1[0], false);
			exp.bundle_rc_out_alpha[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x16, exp.bundle_rc_out_alpha[0], false);
			exp.bundle_rc_out_color[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x18, exp.bundle_rc_out_color[0], false);
			insrt(exp.bundle_rc_out_color[1], 27, 3, 2);
			pgraph_celsius_icmd(&exp, 0x19, exp.bundle_rc_out_color[1], false);
			exp.bundle_rc_final_a = 0xc;
			pgraph_celsius_icmd(&exp, 0x1a, exp.bundle_rc_final_a, false);
			exp.bundle_rc_final_b = rc_final_b;
			pgraph_celsius_icmd(&exp, 0x1b, exp.bundle_rc_final_b, false);
			insrt(exp.bundle_config_a, 14, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 16, 4, extr(val, 16, 4) - 1);
			insrt(exp.bundle_config_a, 22, 1, 1);
			insrt(exp.bundle_config_a, 23, 1, extr(val, 15, 1));
			insrt(exp.bundle_config_a, 24, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 25, 1, 0);
			insrt(exp.bundle_config_a, 26, 1, 0);
			insrt(exp.bundle_config_a, 27, 3, extr(val, 24, 3) ? 0x7 : 0);
			pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, false);
			exp.bundle_stencil_a = 0x70;
			pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, false);
			exp.bundle_stencil_b = 0x222;
			pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, false);
			insrt(exp.bundle_config_b, 0, 9, 0x1c0);
			pgraph_celsius_icmd(&exp, 0x1f, exp.bundle_config_b, false);
			exp.bundle_blend = 0xa | sblend << 4 | dblend << 8;
			pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, false);
			insrt(exp.bundle_raster, 0, 21, 0);
			insrt(exp.bundle_raster, 21, 2, scull == 3 ? 1 : 2);
			insrt(exp.bundle_raster, 23, 5, 8);
			insrt(exp.bundle_raster, 28, 2, scull != 1);
			pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		insrt(exp.valid[1], 17, 1, 1);
		insrt(exp.valid[1], 24, 1, 1);
	}